

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O3

BitMap * re2c::BitMap::find(Go *g,State *x)

{
  uint32_t n2;
  Span *b2;
  BitMap *pBVar1;
  bool bVar2;
  BitMap *pBVar3;
  
  pBVar1 = first;
  if (first != (BitMap *)0x0) {
    b2 = g->span;
    n2 = g->nSpans;
    pBVar3 = first;
    do {
      bVar2 = matches(pBVar3->go->span,pBVar3->go->nSpans,pBVar3->on,b2,n2,x);
      if (bVar2) {
        return pBVar3;
      }
      pBVar3 = pBVar3->next;
    } while (pBVar3 != (BitMap *)0x0);
  }
  first = (BitMap *)operator_new(0x20);
  first->go = g;
  first->on = x;
  first->next = pBVar1;
  first->i = 0;
  first->m = 0;
  return first;
}

Assistant:

const BitMap *BitMap::find(const Go *g, const State *x)
{
	for (const BitMap *b = first; b; b = b->next)
	{
		if (matches(b->go->span, b->go->nSpans, b->on, g->span, g->nSpans, x))
		{
			return b;
		}
	}

	return new BitMap(g, x);
}